

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

int __thiscall
duckdb::QuantileSortTree::WindowScalar<int,int,false>
          (QuantileSortTree *this,QuantileCursor<int> *data,SubFrames *frames,idx_t n,Vector *result
          ,QuantileValue *q)

{
  int iVar1;
  QuantileIndirect<int> *accessor;
  CURSOR *in_RSI;
  unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true> *in_RDI;
  ID indirect;
  idx_t hi_data;
  idx_t lo_data;
  Interpolator<false> interp;
  undefined1 in_stack_ffffffffffffff7f;
  QuantileIndirect<int> in_stack_ffffffffffffff88;
  Interpolator<false> *in_stack_ffffffffffffff90;
  Vector *in_stack_ffffffffffffffa0;
  unsigned_long in_stack_ffffffffffffffa8;
  Interpolator<false> *in_stack_ffffffffffffffb0;
  Interpolator<false> *in_stack_ffffffffffffffb8;
  
  unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>::
  operator->(in_RDI);
  duckdb::WindowMergeSortTree::Build();
  Interpolator<false>::Interpolator
            (in_stack_ffffffffffffff90,(QuantileValue *)in_stack_ffffffffffffff88.data,(idx_t)in_RDI
             ,(bool)in_stack_ffffffffffffff7f);
  accessor = (QuantileIndirect<int> *)
             SelectNth((QuantileSortTree *)in_stack_ffffffffffffff90,
                       (SubFrames *)in_stack_ffffffffffffff88.data,(size_t)in_RDI);
  if (in_stack_ffffffffffffffb8 != in_stack_ffffffffffffffb0) {
    SelectNth((QuantileSortTree *)accessor,(SubFrames *)in_stack_ffffffffffffff88.data,
              (size_t)in_RDI);
  }
  QuantileIndirect<int>::QuantileIndirect((QuantileIndirect<int> *)&stack0xffffffffffffff88,in_RSI);
  iVar1 = Interpolator<false>::Interpolate<unsigned_long,int,duckdb::QuantileIndirect<int>>
                    (in_stack_ffffffffffffffb8,(unsigned_long)in_stack_ffffffffffffffb0,
                     in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,accessor);
  return iVar1;
}

Assistant:

RESULT_TYPE WindowScalar(QuantileCursor<INPUT_TYPE> &data, const SubFrames &frames, const idx_t n, Vector &result,
	                         const QuantileValue &q) {
		D_ASSERT(n > 0);

		//	Thread safe and idempotent.
		index_tree->Build();

		//	Find the interpolated indicies within the frame
		Interpolator<DISCRETE> interp(q, n, false);
		const auto lo_data = SelectNth(frames, interp.FRN);
		auto hi_data = lo_data;
		if (interp.CRN != interp.FRN) {
			hi_data = SelectNth(frames, interp.CRN);
		}

		//	Interpolate indirectly
		using ID = QuantileIndirect<INPUT_TYPE>;
		ID indirect(data);
		return interp.template Interpolate<idx_t, RESULT_TYPE, ID>(lo_data, hi_data, result, indirect);
	}